

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qps.h
# Opt level: O1

void __thiscall qps::qps(qps *this)

{
  thread local_18;
  anon_class_8_1_8991fb9c_for__M_head_impl local_10;
  
  this->stop_ = false;
  (this->thd_)._M_id._M_thread = 0;
  (this->counter_).super___atomic_base<unsigned_int>._M_i = 0;
  local_10.this = this;
  std::thread::thread<qps::qps()::_lambda()_1_,,void>(&local_18,&local_10);
  if ((this->thd_)._M_id._M_thread == 0) {
    (this->thd_)._M_id._M_thread = (native_handle_type)local_18._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

qps() : counter_(0) {
    thd_ = std::thread([this] {
      while (!stop_) {
        std::cout << "qps: " << counter_.load(std::memory_order_acquire)
                  << '\n';
        std::this_thread::sleep_for(std::chrono::seconds(1));
        // counter_.store(0, std::memory_order_release);
      }
    });
  }